

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-util.c
# Opt level: O2

uint32_t read_le32(uchar **buffer)

{
  uint32_t uVar1;
  
  uVar1 = *(uint32_t *)*buffer;
  *buffer = (uchar *)((long)*buffer + 4);
  return uVar1;
}

Assistant:

uint32_t read_le32(unsigned char **buffer)
{
	uint8_t b1, b2, b3, b4;
	b1 = *(uint8_t *)(*buffer);
	b2 = *(uint8_t *)(*buffer + 1);
	b3 = *(uint8_t *)(*buffer + 2);
	b4 = *(uint8_t *)(*buffer + 3);
	uint32_t result = (b1 << 0) | (b2 << 8) | (b3 << 16) | (b4 << 24);
	(*buffer) += 4;
	return result;
}